

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

RuleChain * __thiscall
icu_63::PluralRules::rulesForKeyword(PluralRules *this,UnicodeString *keyword)

{
  UBool UVar1;
  RuleChain *local_20;
  RuleChain *rc;
  UnicodeString *keyword_local;
  PluralRules *this_local;
  
  local_20 = this->mRules;
  while ((local_20 != (RuleChain *)0x0 &&
         (UVar1 = UnicodeString::operator==(&local_20->fKeyword,keyword), UVar1 == '\0'))) {
    local_20 = local_20->fNext;
  }
  return local_20;
}

Assistant:

RuleChain *PluralRules::rulesForKeyword(const UnicodeString &keyword) const {
    RuleChain *rc;
    for (rc = mRules; rc != nullptr; rc = rc->fNext) {
        if (rc->fKeyword == keyword) {
            break;
        }
    }
    return rc;
}